

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int is_ICC_signature(png_alloc_size_t it)

{
  int iVar1;
  undefined1 local_11;
  png_alloc_size_t it_local;
  
  iVar1 = is_ICC_signature_char(it >> 0x18);
  local_11 = false;
  if (iVar1 != 0) {
    iVar1 = is_ICC_signature_char(it >> 0x10 & 0xff);
    local_11 = false;
    if (iVar1 != 0) {
      iVar1 = is_ICC_signature_char(it >> 8 & 0xff);
      local_11 = false;
      if (iVar1 != 0) {
        iVar1 = is_ICC_signature_char(it & 0xff);
        local_11 = iVar1 != 0;
      }
    }
  }
  return (int)local_11;
}

Assistant:

static int
is_ICC_signature(png_alloc_size_t it)
{
   return is_ICC_signature_char(it >> 24) /* checks all the top bits */ &&
      is_ICC_signature_char((it >> 16) & 0xff) &&
      is_ICC_signature_char((it >> 8) & 0xff) &&
      is_ICC_signature_char(it & 0xff);
}